

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<kj::StringPtr> * __thiscall
kj::_::NullableValue<kj::StringPtr>::operator=
          (NullableValue<kj::StringPtr> *this,NullableValue<kj::StringPtr> *other)

{
  NullableValue<kj::StringPtr> *other_local;
  NullableValue<kj::StringPtr> *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<kj::StringPtr>(&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      ctor<kj::StringPtr,kj::StringPtr&>(&(this->field_1).value,&(other->field_1).value);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, other.value);
        isSet = true;
      }
    }
    return *this;
  }